

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::TextureDerivateCase::initPrograms
          (TextureDerivateCase *this,SourceCollections *programCollection)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  ProgramSources *pPVar5;
  Precision PVar6;
  DataType dataType;
  char *local_538;
  char *local_530;
  char *local_510;
  char *local_508;
  char *local_4e8;
  char *local_4e0;
  Precision local_474;
  Vector<float,_4> local_450;
  Vector<float,_4> local_440;
  Vector<float,_4> local_430;
  Vector<float,_4> local_420;
  undefined8 local_410;
  undefined8 local_408;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined8 local_3e8;
  Vector<float,_4> local_3e0;
  Vector<float,_4> local_3d0;
  undefined1 local_3c0 [8];
  Vec4 dy;
  Vector<float,_4> local_3a0;
  undefined1 local_390 [8];
  Vec4 dx;
  float h;
  float w;
  UVec2 viewportSize;
  float local_368 [2];
  Vector<float,_4> local_360;
  Vector<float,_4> local_350;
  Vector<float,_4> local_340;
  Vector<float,_4> local_330;
  Vector<float,_4> local_320;
  Vector<float,_4> local_310;
  Vector<float,_4> local_300;
  Vector<float,_4> local_2f0;
  Vector<float,_4> local_2e0;
  ShaderSource local_2d0;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  ShaderSource local_260;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  StringTemplate local_1e8;
  undefined1 local_1c8 [8];
  string fragmentSrc;
  key_type local_1a0;
  allocator<char> local_179;
  key_type local_178;
  allocator<char> local_151;
  key_type local_150;
  allocator<char> local_129;
  key_type local_128;
  allocator<char> local_101;
  key_type local_100;
  allocator<char> local_d9;
  key_type local_d8;
  allocator<char> local_b1;
  key_type local_b0;
  allocator<char> local_89;
  key_type local_88;
  undefined1 local_58 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragmentParams;
  bool packToInt;
  char *fragmentTmpl;
  SourceCollections *programCollection_local;
  TextureDerivateCase *this_local;
  
  PVar6 = 0x1310565;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
       (this->super_TriangleDerivateCase).m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_58);
  dataType = TYPE_FLOAT_VEC4;
  if ((fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
    dataType = TYPE_UINT_VEC4;
  }
  pcVar3 = glu::getDataTypeName(dataType);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"OUTPUT_TYPE",&local_89);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_58,&local_88);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  if ((fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    local_474 = (this->super_TriangleDerivateCase).m_definitions.precision;
  }
  else {
    local_474 = PRECISION_HIGHP;
  }
  pcVar3 = glu::getPrecisionName(local_474);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"OUTPUT_PREC",&local_b1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_58,&local_b0);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  pcVar3 = glu::getPrecisionName((this->super_TriangleDerivateCase).m_definitions.precision);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"PRECISION",&local_d9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_58,&local_d8);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pcVar3 = glu::getDataTypeName((this->super_TriangleDerivateCase).m_definitions.dataType);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"DATATYPE",&local_101);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_58,&local_100);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  pcVar3 = getDerivateFuncName((this->super_TriangleDerivateCase).m_definitions.func);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"FUNC",&local_129);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_58,&local_128);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  if ((this->super_TriangleDerivateCase).m_definitions.dataType == TYPE_FLOAT_VEC4) {
    local_4e0 = "";
  }
  else {
    if ((this->super_TriangleDerivateCase).m_definitions.dataType == TYPE_FLOAT_VEC3) {
      local_4e8 = ".xyz";
    }
    else {
      local_4e8 = ".x";
      PVar6 = 0x1310776;
      if ((this->super_TriangleDerivateCase).m_definitions.dataType == TYPE_FLOAT_VEC2) {
        local_4e8 = ".xy";
      }
    }
    local_4e0 = local_4e8;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"SWIZZLE",&local_151);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_58,&local_150);
  std::__cxx11::string::operator=((string *)pmVar4,local_4e0);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  if ((fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    if ((this->super_TriangleDerivateCase).m_definitions.dataType == TYPE_FLOAT_VEC4) {
      local_530 = "res";
    }
    else {
      if ((this->super_TriangleDerivateCase).m_definitions.dataType == TYPE_FLOAT_VEC3) {
        local_538 = "vec4(res, 1.0)";
      }
      else {
        local_538 = "vec4(res, 0.0, 0.0, 1.0)";
        PVar6 = 0x1310151;
        if ((this->super_TriangleDerivateCase).m_definitions.dataType == TYPE_FLOAT_VEC2) {
          local_538 = "vec4(res, 0.0, 1.0)";
        }
      }
      local_530 = local_538;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"CAST_TO_OUTPUT",
               (allocator<char> *)(fragmentSrc.field_2._M_local_buf + 0xf));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_58,&local_1a0);
    std::__cxx11::string::operator=((string *)pmVar4,local_530);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)(fragmentSrc.field_2._M_local_buf + 0xf));
  }
  else {
    if ((this->super_TriangleDerivateCase).m_definitions.dataType == TYPE_FLOAT_VEC4) {
      local_508 = "floatBitsToUint(res)";
    }
    else {
      if ((this->super_TriangleDerivateCase).m_definitions.dataType == TYPE_FLOAT_VEC3) {
        local_510 = "floatBitsToUint(vec4(res, 1.0))";
      }
      else {
        local_510 = "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
        PVar6 = 0x131036b;
        if ((this->super_TriangleDerivateCase).m_definitions.dataType == TYPE_FLOAT_VEC2) {
          local_510 = "floatBitsToUint(vec4(res, 0.0, 1.0))";
        }
      }
      local_508 = local_510;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"CAST_TO_OUTPUT",&local_179);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_58,&local_178);
    std::__cxx11::string::operator=((string *)pmVar4,local_508);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,
             "#version 450\nlayout(location = 0) in highp vec2 v_coord;\nlayout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\nlayout(binding = 0, std140) uniform Scale { ${PRECISION} ${DATATYPE} u_scale; };\nlayout(binding = 1, std140) uniform Bias { ${PRECISION} ${DATATYPE} u_bias; };\nlayout(binding = 2) uniform ${PRECISION} sampler2D u_sampler;\nvoid main (void)\n{\n\t${PRECISION} vec4 tex = texture(u_sampler, v_coord);\n\t${PRECISION} ${DATATYPE} res = ${FUNC}(tex${SWIZZLE}) * u_scale + u_bias;\n\to_color = ${CAST_TO_OUTPUT};\n}\n"
             ,&local_209);
  tcu::StringTemplate::StringTemplate(&local_1e8,&local_208);
  tcu::StringTemplate::specialize
            ((string *)local_1c8,&local_1e8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_58);
  tcu::StringTemplate::~StringTemplate(&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"vert",&local_231);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_230);
  sr::(anonymous_namespace)::genVertexSource_abi_cxx11_
            (&local_280,
             (_anonymous_namespace_ *)
             (ulong)(this->super_TriangleDerivateCase).m_definitions.coordDataType,
             (this->super_TriangleDerivateCase).m_definitions.coordPrecision,PVar6);
  glu::VertexSource::VertexSource((VertexSource *)&local_260,&local_280);
  glu::ProgramSources::operator<<(pPVar5,&local_260);
  glu::VertexSource::~VertexSource((VertexSource *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"frag",&local_2a1);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_2a0);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_2d0,(string *)local_1c8);
  glu::ProgramSources::operator<<(pPVar5,&local_2d0);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::__cxx11::string::~string((string *)local_1c8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_58);
  PVar6 = (this->super_TriangleDerivateCase).m_definitions.precision;
  if (PVar6 == PRECISION_LOWP) {
    tcu::Vector<float,_4>::Vector(&local_320,0.0,-1.0,0.0,1.0);
    *(undefined8 *)&(this->super_TriangleDerivateCase).field_0x13c = local_320.m_data._0_8_;
    *(float *)&this->field_0x144 = local_320.m_data[2];
    *(float *)&this->field_0x148 = local_320.m_data[3];
    tcu::Vector<float,_4>::Vector(&local_330,1.0,1.0,-1.0,-1.0);
    *(float *)&this->field_0x14c = local_330.m_data[0];
    *(float *)&this->field_0x150 = local_330.m_data[1];
    *(float *)&this->field_0x154 = local_330.m_data[2];
    *(float *)&this->field_0x158 = local_330.m_data[3];
  }
  else if (PVar6 == PRECISION_MEDIUMP) {
    tcu::Vector<float,_4>::Vector(&local_300,-37.0,47.0,-7.0,0.0);
    *(undefined8 *)&(this->super_TriangleDerivateCase).field_0x13c = local_300.m_data._0_8_;
    *(float *)&this->field_0x144 = local_300.m_data[2];
    *(float *)&this->field_0x148 = local_300.m_data[3];
    tcu::Vector<float,_4>::Vector(&local_310,-1.0,12.0,7.0,19.0);
    *(float *)&this->field_0x14c = local_310.m_data[0];
    *(float *)&this->field_0x150 = local_310.m_data[1];
    *(float *)&this->field_0x154 = local_310.m_data[2];
    *(float *)&this->field_0x158 = local_310.m_data[3];
  }
  else if (PVar6 == PRECISION_HIGHP) {
    tcu::Vector<float,_4>::Vector(&local_2e0,-97.0,0.2,71.0,74.0);
    *(undefined8 *)&(this->super_TriangleDerivateCase).field_0x13c = local_2e0.m_data._0_8_;
    *(float *)&this->field_0x144 = local_2e0.m_data[2];
    *(float *)&this->field_0x148 = local_2e0.m_data[3];
    tcu::Vector<float,_4>::Vector(&local_2f0,-13.2,-77.0,44.0,76.0);
    *(float *)&this->field_0x14c = local_2f0.m_data[0];
    *(float *)&this->field_0x150 = local_2f0.m_data[1];
    *(float *)&this->field_0x154 = local_2f0.m_data[2];
    *(float *)&this->field_0x158 = local_2f0.m_data[3];
  }
  tcu::Vector<float,_4>::Vector(&local_340,0.0);
  *(undefined8 *)(this->super_TriangleDerivateCase).m_values.coordMin.m_data =
       local_340.m_data._0_8_;
  *(undefined8 *)((this->super_TriangleDerivateCase).m_values.coordMin.m_data + 2) =
       local_340.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_350,1.0);
  *(undefined8 *)(this->super_TriangleDerivateCase).m_values.coordMax.m_data =
       local_350.m_data._0_8_;
  *(undefined8 *)((this->super_TriangleDerivateCase).m_values.coordMax.m_data + 2) =
       local_350.m_data._8_8_;
  if ((this->super_TriangleDerivateCase).m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO) {
    tcu::Vector<float,_4>::Vector(&local_360,1.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_values.derivScale.m_data =
         local_360.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_values.derivScale.m_data + 2) =
         local_360.m_data._8_8_;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&viewportSize,0.0);
    *(uint (*) [2])(this->super_TriangleDerivateCase).m_values.derivBias.m_data =
         viewportSize.m_data;
    *(float (*) [2])((this->super_TriangleDerivateCase).m_values.derivBias.m_data + 2) = local_368;
  }
  else {
    tcu::Vector<unsigned_int,_2>::Vector((Vector<unsigned_int,_2> *)&h,99,0x85);
    uVar2 = tcu::Vector<unsigned_int,_2>::x((Vector<unsigned_int,_2> *)&h);
    dx.m_data[3] = (float)uVar2;
    uVar2 = tcu::Vector<unsigned_int,_2>::y((Vector<unsigned_int,_2> *)&h);
    dx.m_data[2] = (float)uVar2;
    tcu::operator-((tcu *)&local_3a0,(Vector<float,_4> *)&this->field_0x14c,
                   (Vector<float,_4> *)&(this->super_TriangleDerivateCase).field_0x13c);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(dy.m_data + 2),dx.m_data[3],dx.m_data[3],dx.m_data[3] * 0.5,
               -dx.m_data[3] * 0.5);
    tcu::operator/((tcu *)local_390,&local_3a0,(Vector<float,_4> *)(dy.m_data + 2));
    tcu::operator-((tcu *)&local_3d0,(Vector<float,_4> *)&this->field_0x14c,
                   (Vector<float,_4> *)&(this->super_TriangleDerivateCase).field_0x13c);
    tcu::Vector<float,_4>::Vector
              (&local_3e0,dx.m_data[2],dx.m_data[2],dx.m_data[2] * 0.5,-dx.m_data[2] * 0.5);
    tcu::operator/((tcu *)local_3c0,&local_3d0,&local_3e0);
    bVar1 = isDfdxFunc((this->super_TriangleDerivateCase).m_definitions.func);
    if (bVar1) {
      tcu::operator/((tcu *)&local_3f0,0.5,(Vector<float,_4> *)local_390);
      *(undefined8 *)(this->super_TriangleDerivateCase).m_values.derivScale.m_data = local_3f0;
      *(undefined8 *)((this->super_TriangleDerivateCase).m_values.derivScale.m_data + 2) = local_3e8
      ;
    }
    else {
      bVar1 = isDfdyFunc((this->super_TriangleDerivateCase).m_definitions.func);
      if (bVar1) {
        tcu::operator/((tcu *)&local_400,0.5,(Vector<float,_4> *)local_3c0);
        *(undefined8 *)(this->super_TriangleDerivateCase).m_values.derivScale.m_data = local_400;
        *(undefined8 *)((this->super_TriangleDerivateCase).m_values.derivScale.m_data + 2) =
             local_3f8;
      }
      else {
        bVar1 = isFwidthFunc((this->super_TriangleDerivateCase).m_definitions.func);
        if (bVar1) {
          tcu::abs<float,4>((tcu *)&local_430,(Vector<float,_4> *)local_390);
          tcu::abs<float,4>((tcu *)&local_440,(Vector<float,_4> *)local_3c0);
          tcu::operator+((tcu *)&local_420,&local_430,&local_440);
          tcu::operator/((tcu *)&local_410,0.5,&local_420);
          *(undefined8 *)(this->super_TriangleDerivateCase).m_values.derivScale.m_data = local_410;
          *(undefined8 *)((this->super_TriangleDerivateCase).m_values.derivScale.m_data + 2) =
               local_408;
        }
      }
    }
    tcu::Vector<float,_4>::Vector(&local_450,0.0,0.0,0.0,0.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_values.derivBias.m_data =
         local_450.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_values.derivBias.m_data + 2) =
         local_450.m_data._8_8_;
  }
  return;
}

Assistant:

void TextureDerivateCase::initPrograms (vk::SourceCollections& programCollection) const
{
	// Generate shader
	{
		const char* fragmentTmpl =
			"#version 450\n"
			"layout(location = 0) in highp vec2 v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"layout(binding = 0, std140) uniform Scale { ${PRECISION} ${DATATYPE} u_scale; };\n"
			"layout(binding = 1, std140) uniform Bias { ${PRECISION} ${DATATYPE} u_bias; };\n"
			"layout(binding = 2) uniform ${PRECISION} sampler2D u_sampler;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} vec4 tex = texture(u_sampler, v_coord);\n"
			"	${PRECISION} ${DATATYPE} res = ${FUNC}(tex${SWIZZLE}) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n";

		const bool			packToInt		= m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO;
		map<string, string> fragmentParams;

		fragmentParams["OUTPUT_TYPE"]		= glu::getDataTypeName(packToInt ? glu::TYPE_UINT_VEC4 : glu::TYPE_FLOAT_VEC4);
		fragmentParams["OUTPUT_PREC"]		= glu::getPrecisionName(packToInt ? glu::PRECISION_HIGHP : m_definitions.precision);
		fragmentParams["PRECISION"]			= glu::getPrecisionName(m_definitions.precision);
		fragmentParams["DATATYPE"]			= glu::getDataTypeName(m_definitions.dataType);
		fragmentParams["FUNC"]				= getDerivateFuncName(m_definitions.func);
		fragmentParams["SWIZZLE"]			= m_definitions.dataType == glu::TYPE_FLOAT_VEC4 ? "" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC3 ? ".xyz" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC2 ? ".xy" :
											  /* TYPE_FLOAT */								   ".x";

		if (packToInt)
		{
			fragmentParams["CAST_TO_OUTPUT"]	= m_definitions.dataType == glu::TYPE_FLOAT_VEC4 ? "floatBitsToUint(res)" :
												  m_definitions.dataType == glu::TYPE_FLOAT_VEC3 ? "floatBitsToUint(vec4(res, 1.0))" :
												  m_definitions.dataType == glu::TYPE_FLOAT_VEC2 ? "floatBitsToUint(vec4(res, 0.0, 1.0))" :
												  /* TYPE_FLOAT */								   "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
		}
		else
		{
			fragmentParams["CAST_TO_OUTPUT"]	= m_definitions.dataType == glu::TYPE_FLOAT_VEC4 ? "res" :
												  m_definitions.dataType == glu::TYPE_FLOAT_VEC3 ? "vec4(res, 1.0)" :
												  m_definitions.dataType == glu::TYPE_FLOAT_VEC2 ? "vec4(res, 0.0, 1.0)" :
												  /* TYPE_FLOAT */								   "vec4(res, 0.0, 0.0, 1.0)";
		}

		std::string fragmentSrc = tcu::StringTemplate(fragmentTmpl).specialize(fragmentParams);
		programCollection.glslSources.add("vert") << glu::VertexSource(genVertexSource(m_definitions.coordDataType, m_definitions.coordPrecision));
		programCollection.glslSources.add("frag") << glu::FragmentSource(fragmentSrc);
	}

	// Texture size matches viewport and nearest sampling is used. Thus texture sampling
	// is equal to just interpolating the texture value range.

	// Determine value range for texture.

	switch (m_definitions.precision)
	{
		case glu::PRECISION_HIGHP:
			m_textureValues.texValueMin = tcu::Vec4(-97.f, 0.2f, 71.f, 74.f);
			m_textureValues.texValueMax = tcu::Vec4(-13.2f, -77.f, 44.f, 76.f);
			break;

		case glu::PRECISION_MEDIUMP:
			m_textureValues.texValueMin = tcu::Vec4(-37.0f, 47.f, -7.f, 0.0f);
			m_textureValues.texValueMax = tcu::Vec4(-1.0f, 12.f, 7.f, 19.f);
			break;

		case glu::PRECISION_LOWP:
			m_textureValues.texValueMin = tcu::Vec4(0.0f, -1.0f, 0.0f, 1.0f);
			m_textureValues.texValueMax = tcu::Vec4(1.0f, 1.0f, -1.0f, -1.0f);
			break;

		default:
			DE_ASSERT(false);
	}

	// Texture coordinates
	m_values.coordMin = tcu::Vec4(0.0f);
	m_values.coordMax = tcu::Vec4(1.0f);

	if (m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO)
	{
		// No scale or bias used for accuracy.
		m_values.derivScale		= tcu::Vec4(1.0f);
		m_values.derivBias		= tcu::Vec4(0.0f);
	}
	else
	{
		// Compute scale - bias that normalizes to 0..1 range.
		const tcu::UVec2	viewportSize	(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
		const float			w				= float(viewportSize.x());
		const float			h				= float(viewportSize.y());
		const tcu::Vec4		dx				= (m_textureValues.texValueMax - m_textureValues.texValueMin) / tcu::Vec4(w, w, w*0.5f, -w*0.5f);
		const tcu::Vec4		dy				= (m_textureValues.texValueMax - m_textureValues.texValueMin) / tcu::Vec4(h, h, h*0.5f, -h*0.5f);

		if (isDfdxFunc(m_definitions.func))
			m_values.derivScale = 0.5f / dx;
		else if (isDfdyFunc(m_definitions.func))
			m_values.derivScale = 0.5f / dy;
		else if (isFwidthFunc(m_definitions.func))
			m_values.derivScale = 0.5f / (tcu::abs(dx) + tcu::abs(dy));
		else
			DE_ASSERT(false);

		m_values.derivBias = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}